

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_reset_dirty_x86_64(CPUState *cpu,ram_addr_t start1,ram_addr_t length)

{
  uintptr_t uVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  uintptr_t length_00;
  long lVar5;
  long lVar6;
  
  uVar1 = (long)cpu->env_ptr - 0x40;
  lVar6 = (long)cpu->env_ptr + -0x840;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    puVar2 = (ulong *)(uVar1 + lVar4 * 0x10);
    uVar3 = *puVar2;
    length_00 = uVar1;
    for (lVar5 = 0; (ulong)((int)(uVar3 >> 6) + 1) << 6 != lVar5; lVar5 = lVar5 + 0x40) {
      tlb_reset_dirty_range_locked
                ((uc_struct_conflict *)(puVar2[1] + lVar5),(CPUTLBEntry *)start1,length,length_00);
    }
    for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x40) {
      tlb_reset_dirty_range_locked
                ((uc_struct_conflict *)(lVar6 + lVar5),(CPUTLBEntry *)start1,length,length_00);
    }
    lVar6 = lVar6 + 0x2b8;
  }
  return;
}

Assistant:

void tlb_reset_dirty(CPUState *cpu, ram_addr_t start1, ram_addr_t length)
{
    struct uc_struct *uc = cpu->uc;
    CPUArchState *env;

    int mmu_idx;

    env = cpu->env_ptr;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        unsigned int i;
        unsigned int n = tlb_n_entries(&env_tlb(env)->f[mmu_idx]);

        for (i = 0; i < n; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->f[mmu_idx].table[i],
                                         start1, length);
        }

        for (i = 0; i < CPU_VTLB_SIZE; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->d[mmu_idx].vtable[i],
                                         start1, length);
        }
    }
}